

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.h
# Opt level: O1

void TTD::NSLogEvents::CreateError_Execute<(TTD::NSLogEvents::EventKind)25>
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  ScriptContext *ctx;
  Var local_30;
  Var res;
  
  if (evt->EventKind == CreateReferenceErrorActionTag) {
    local_30 = (Var)0x0;
    ctx = ThreadContextTTD::GetActiveScriptContext(executeContext);
    Execute_CreateErrorHelper
              ((JsRTSingleVarArgumentAction *)(evt + 1),executeContext,ctx,
               CreateReferenceErrorActionTag,&local_30);
    if (local_30 != (Var)0x0) {
      JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)25>
                (executeContext,evt,local_30);
    }
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void CreateError_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            const JsRTSingleVarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarArgumentAction, errorKind>(evt);

            Js::Var res = nullptr;
            Execute_CreateErrorHelper(action, executeContext, executeContext->GetActiveScriptContext(), errorKind, &res);

            if(res != nullptr)
            {
                JsRTActionHandleResultForReplay<JsRTSingleVarArgumentAction, errorKind>(executeContext, evt, res);
            }
        }